

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserBase.cpp
# Opt level: O2

Token __thiscall slang::parsing::ParserBase::peek(ParserBase *this)

{
  Token *pTVar1;
  Token *pTVar2;
  undefined2 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined4 uVar6;
  undefined1 uVar7;
  NumericTokenFlags NVar8;
  uint32_t uVar9;
  ulong uVar10;
  Info *pIVar11;
  Token TVar12;
  
  pTVar1 = &(this->window).currentToken;
  pIVar11 = (this->window).currentToken.info;
  if (pIVar11 == (Info *)0x0) {
    uVar10 = (this->window).currentOffset;
    if ((this->window).count <= uVar10) {
      Window::addNew(&this->window);
      uVar10 = (this->window).currentOffset;
    }
    pTVar2 = (this->window).buffer + uVar10;
    uVar7 = pTVar2->field_0x2;
    NVar8.raw = (pTVar2->numFlags).raw;
    uVar9 = pTVar2->rawLen;
    pIVar11 = pTVar2->info;
    pTVar1->kind = pTVar2->kind;
    pTVar1->field_0x2 = uVar7;
    pTVar1->numFlags = (NumericTokenFlags)NVar8.raw;
    pTVar1->rawLen = uVar9;
    (this->window).currentToken.info = pIVar11;
    pIVar11 = (this->window).currentToken.info;
  }
  uVar3 = pTVar1->kind;
  uVar4 = pTVar1->field_0x2;
  uVar5 = pTVar1->numFlags;
  uVar6 = pTVar1->rawLen;
  TVar12.rawLen = uVar6;
  TVar12.numFlags.raw = uVar5;
  TVar12._2_1_ = uVar4;
  TVar12.kind = uVar3;
  TVar12.info = pIVar11;
  return TVar12;
}

Assistant:

Token ParserBase::peek() {
    if (!window.currentToken) {
        if (window.currentOffset >= window.count)
            window.addNew();
        window.currentToken = window.buffer[window.currentOffset];
    }
    SLANG_ASSERT(window.currentToken);
    return window.currentToken;
}